

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContextWrapper::ClientContextWrapper
          (ClientContextWrapper *this,shared_ptr<duckdb::ClientContext,_true> *context)

{
  this->_vptr_ClientContextWrapper = (_func_int **)&PTR__ClientContextWrapper_02798258;
  ::std::__weak_ptr<duckdb::ClientContext,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<duckdb::ClientContext,void>
            ((__weak_ptr<duckdb::ClientContext,(__gnu_cxx::_Lock_policy)2> *)&this->client_context,
             (__shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)context);
  return;
}

Assistant:

ClientContextWrapper::ClientContextWrapper(const shared_ptr<ClientContext> &context) : client_context(context) {
}